

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void * Curl_hash_add2(Curl_hash *h,void *key,size_t key_len,void *p,Curl_hash_elem_dtor dtor)

{
  void *pvVar1;
  Curl_hash_element **ppCVar2;
  size_t sVar3;
  Curl_hash_element *pCVar4;
  Curl_hash_element *pCVar5;
  
  ppCVar2 = h->table;
  if (ppCVar2 == (Curl_hash_element **)0x0) {
    ppCVar2 = (Curl_hash_element **)(*Curl_ccalloc)(h->slots,8);
    h->table = ppCVar2;
    if (ppCVar2 == (Curl_hash_element **)0x0) {
      return (void *)0x0;
    }
  }
  sVar3 = (*h->hash_func)(key,key_len,h->slots);
  pCVar5 = (Curl_hash_element *)(ppCVar2 + sVar3);
  pCVar4 = pCVar5;
  while (pCVar4 = pCVar4->next, pCVar4 != (Curl_hash_element *)0x0) {
    sVar3 = (*h->comp_func)(pCVar4->key,pCVar4->key_len,key,key_len);
    if (sVar3 != 0) {
      pvVar1 = pCVar4->ptr;
      if (pvVar1 != (void *)0x0) {
        if (pCVar4->dtor == (Curl_hash_elem_dtor)0x0) {
          (*h->dtor)(pvVar1);
        }
        else {
          (*pCVar4->dtor)(pCVar4->key,pCVar4->key_len,pvVar1);
        }
        pCVar4->ptr = (void *)0x0;
      }
      pCVar4->ptr = p;
      pCVar4->dtor = dtor;
      return p;
    }
  }
  pCVar4 = (Curl_hash_element *)(*Curl_cmalloc)(key_len + 0x28);
  if (pCVar4 == (Curl_hash_element *)0x0) {
    return (void *)0x0;
  }
  pCVar4->next = (Curl_hash_element *)0x0;
  memcpy(pCVar4->key,key,key_len);
  pCVar4->key_len = key_len;
  pCVar4->ptr = p;
  pCVar4->dtor = dtor;
  pCVar4->next = pCVar5->next;
  pCVar5->next = pCVar4;
  h->size = h->size + 1;
  return p;
}

Assistant:

void *Curl_hash_add2(struct Curl_hash *h, void *key, size_t key_len, void *p,
                     Curl_hash_elem_dtor dtor)
{
  struct Curl_hash_element *he, **slot;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(!h->table) {
    h->table = calloc(h->slots, sizeof(struct Curl_hash_element *));
    if(!h->table)
      return NULL; /* OOM */
  }

  slot = CURL_HASH_SLOT_ADDR(h, key, key_len);
  for(he = *slot; he; he = he->next) {
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      /* existing key entry, overwrite by clearing old pointer */
      hash_elem_clear_ptr(h, he);
      he->ptr = (void *)p;
      he->dtor = dtor;
      return p;
    }
  }

  he = hash_elem_create(key, key_len, p, dtor);
  if(!he)
    return NULL; /* OOM */

  hash_elem_link(h, slot, he);
  return p; /* return the new entry */
}